

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall Parser::AddFastScannedRegExpNode(Parser *this,ParseNodePtr pnode)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  DList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  TrackAllocData local_40;
  ParseNodePtr local_18;
  ParseNodePtr pnode_local;
  Parser *this_local;
  
  local_18 = pnode;
  pnode_local = (ParseNodePtr)this;
  bVar2 = IsBackgroundParser(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x3061,"(!IsBackgroundParser())","!IsBackgroundParser()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((this->m_doingFastScan & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x3062,"(m_doingFastScan)","m_doingFastScan");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->fastScannedRegExpNodes == (NodeDList *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&DList<ParseNode*,Memory::ArenaAllocator,RealCount>::typeinfo,
               0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
               ,0x3066);
    alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           this,&local_40);
    this_00 = (DList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
              new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)alloc,0x3f67b0);
    DList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::DList(this_00,&this->m_nodeAllocator);
    this->fastScannedRegExpNodes = this_00;
  }
  DList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Append
            (this->fastScannedRegExpNodes,&local_18);
  return;
}

Assistant:

void Parser::AddFastScannedRegExpNode(ParseNodePtr const pnode)
{
    Assert(!IsBackgroundParser());
    Assert(m_doingFastScan);

    if (fastScannedRegExpNodes == nullptr)
    {
        fastScannedRegExpNodes = Anew(&m_nodeAllocator, NodeDList, &m_nodeAllocator);
    }
    fastScannedRegExpNodes->Append(pnode);
}